

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
::find_or_prepare_insert<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i match;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar10 [16];
  pair<unsigned_long,_bool> pVar26;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_88;
  size_t local_70;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::probe(&local_88,
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)this,hashval);
  auVar7 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar6 = auVar7._0_4_;
  auVar7._4_4_ = uVar6;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = uVar6;
  do {
    pcVar1 = (char *)(*(long *)this + local_88.offset_);
    auVar8[0] = -(auVar7[0] == *pcVar1);
    auVar8[1] = -(auVar7[1] == pcVar1[1]);
    auVar8[2] = -(auVar7[2] == pcVar1[2]);
    auVar8[3] = -(auVar7[3] == pcVar1[3]);
    auVar8[4] = -(auVar7[4] == pcVar1[4]);
    auVar8[5] = -(auVar7[5] == pcVar1[5]);
    auVar8[6] = -(auVar7[6] == pcVar1[6]);
    auVar8[7] = -(auVar7[7] == pcVar1[7]);
    auVar8[8] = -(auVar7[8] == pcVar1[8]);
    auVar8[9] = -(auVar7[9] == pcVar1[9]);
    auVar8[10] = -(auVar7[10] == pcVar1[10]);
    auVar8[0xb] = -(auVar7[0xb] == pcVar1[0xb]);
    auVar8[0xc] = -(auVar7[0xc] == pcVar1[0xc]);
    auVar8[0xd] = -(auVar7[0xd] == pcVar1[0xd]);
    auVar8[0xe] = -(auVar7[0xe] == pcVar1[0xe]);
    auVar8[0xf] = -(auVar7[0xf] == pcVar1[0xf]);
    cVar9 = *pcVar1;
    cVar11 = pcVar1[1];
    cVar12 = pcVar1[2];
    cVar13 = pcVar1[3];
    cVar14 = pcVar1[4];
    cVar15 = pcVar1[5];
    cVar16 = pcVar1[6];
    cVar17 = pcVar1[7];
    cVar18 = pcVar1[8];
    cVar19 = pcVar1[9];
    cVar20 = pcVar1[10];
    cVar21 = pcVar1[0xb];
    cVar22 = pcVar1[0xc];
    cVar23 = pcVar1[0xd];
    cVar24 = pcVar1[0xe];
    cVar25 = pcVar1[0xf];
    for (uVar4 = (uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar8[0xf] >> 7) << 0xf); uVar4 != 0;
        uVar4 = uVar4 - 1 & uVar4) {
      uVar2 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
        }
      }
      local_70 = hashval;
      local_68.rhs = key;
      local_68.eq = (key_equal *)(this + 0x28);
      local_58 = cVar9;
      cStack_57 = cVar11;
      cStack_56 = cVar12;
      cStack_55 = cVar13;
      cStack_54 = cVar14;
      cStack_53 = cVar15;
      cStack_52 = cVar16;
      cStack_51 = cVar17;
      cStack_50 = cVar18;
      cStack_4f = cVar19;
      cStack_4e = cVar20;
      cStack_4d = cVar21;
      cStack_4c = cVar22;
      cStack_4b = cVar23;
      cStack_4a = cVar24;
      cStack_49 = cVar25;
      local_48 = auVar7;
      bVar3 = DecomposePair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>::EqualElement<std::__cxx11::string>,std::pair<std::__cxx11::string_const,unsigned_long>&>
                        (&local_68,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                          *)((local_88.offset_ + uVar2 & local_88.mask_) * 0x28 +
                            *(long *)(this + 8)));
      if (bVar3) {
        local_88.mask_ = uVar2 + local_88.offset_ & local_88.mask_;
        uVar5 = 0;
        goto LAB_002568ff;
      }
      hashval = local_70;
      auVar7 = local_48;
      cVar9 = local_58;
      cVar11 = cStack_57;
      cVar12 = cStack_56;
      cVar13 = cStack_55;
      cVar14 = cStack_54;
      cVar15 = cStack_53;
      cVar16 = cStack_52;
      cVar17 = cStack_51;
      cVar18 = cStack_50;
      cVar19 = cStack_4f;
      cVar20 = cStack_4e;
      cVar21 = cStack_4d;
      cVar22 = cStack_4c;
      cVar23 = cStack_4b;
      cVar24 = cStack_4a;
      cVar25 = cStack_49;
    }
    auVar10[0] = -(cVar9 == -0x80);
    auVar10[1] = -(cVar11 == -0x80);
    auVar10[2] = -(cVar12 == -0x80);
    auVar10[3] = -(cVar13 == -0x80);
    auVar10[4] = -(cVar14 == -0x80);
    auVar10[5] = -(cVar15 == -0x80);
    auVar10[6] = -(cVar16 == -0x80);
    auVar10[7] = -(cVar17 == -0x80);
    auVar10[8] = -(cVar18 == -0x80);
    auVar10[9] = -(cVar19 == -0x80);
    auVar10[10] = -(cVar20 == -0x80);
    auVar10[0xb] = -(cVar21 == -0x80);
    auVar10[0xc] = -(cVar22 == -0x80);
    auVar10[0xd] = -(cVar23 == -0x80);
    auVar10[0xe] = -(cVar24 == -0x80);
    auVar10[0xf] = -(cVar25 == -0x80);
    if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar25 == -0x80) {
      local_88.mask_ =
           raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ::prepare_insert((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)this,hashval);
      uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_002568ff:
      pVar26._8_8_ = uVar5;
      pVar26.first = local_88.mask_;
      return pVar26;
    }
    local_88.index_ = local_88.index_ + 0x10;
    local_88.offset_ = local_88.index_ + local_88.offset_ & local_88.mask_;
  } while( true );
}

Assistant:

std::pair<size_t, bool> find_or_prepare_insert(const K& key, size_t hashval)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ctrl_ + seq.offset()};
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + seq.offset((size_t)i)))))
							return {seq.offset((size_t)i), false};
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty())) break;
					seq.next();
				}
				return {prepare_insert(hashval), true};
			}